

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  BYTE *pBVar2;
  undefined8 *puVar3;
  U32 *pUVar4;
  seqDef *psVar5;
  ulong uVar6;
  char cVar7;
  undefined8 uVar8;
  U32 lowestValid;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  ulong *puVar12;
  uint uVar13;
  long lVar14;
  ulong *puVar15;
  uint uVar16;
  int iVar17;
  ulong *puVar18;
  ulong *puVar19;
  BYTE *pBVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  ulong *puVar27;
  uint uVar28;
  ulong uVar29;
  BYTE *litEnd;
  BYTE *pInLoopLimit;
  size_t offbaseFound;
  BYTE *litLimit_w;
  size_t local_a8;
  uint local_9c;
  BYTE *local_98;
  uint local_8c;
  ulong local_88;
  ulong *local_80;
  ulong *local_78;
  ulong local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  BYTE *local_58;
  ulong *local_50;
  ulong *local_48;
  ulong *local_40;
  uint *local_38;
  
  local_98 = (ms->window).base;
  uVar9 = (ms->window).dictLimit;
  local_58 = local_98 + uVar9;
  local_8c = (ms->cParams).minMatch;
  if (5 < local_8c) {
    local_8c = 6;
  }
  if (local_8c < 5) {
    local_8c = 4;
  }
  local_9c = (ms->cParams).searchLog;
  uVar16 = 6;
  if (local_9c < 6) {
    uVar16 = local_9c;
  }
  if (uVar16 < 5) {
    uVar16 = 4;
  }
  puVar18 = (ulong *)((ulong)((int)src == (int)local_58) + (long)src);
  uVar25 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar17 = (int)puVar18 - (int)local_98;
  local_60 = *rep;
  local_5c = iVar17 - uVar25;
  if (iVar17 - uVar9 <= uVar25) {
    local_5c = uVar9;
  }
  uVar25 = 0;
  if (ms->loadedDictEnd != 0) {
    local_5c = uVar9;
  }
  local_64 = rep[1];
  local_5c = iVar17 - local_5c;
  uVar9 = local_64;
  if (local_5c < local_64) {
    uVar9 = uVar25;
  }
  local_88 = CONCAT44(local_88._4_4_,uVar9);
  uVar26 = local_60;
  if (local_5c < local_60) {
    uVar26 = uVar25;
  }
  ms->lazySkipping = 0;
  local_78 = (ulong *)((long)src + (srcSize - 0x10));
  uVar11 = ms->nextToUpdate;
  uVar21 = (ulong)uVar11;
  uVar13 = ((int)local_78 - (int)(local_98 + uVar21)) + 1;
  uVar28 = 8;
  if (uVar13 < 8) {
    uVar28 = uVar13;
  }
  if (local_78 < local_98 + uVar21) {
    uVar28 = uVar25;
  }
  bVar10 = (byte)uVar16;
  local_38 = rep;
  if (uVar11 < uVar28 + uVar11) {
    local_80 = (ulong *)srcSize;
    if (0x20 < ms->rowHashLog + 8) {
LAB_0079a886:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar4 = ms->hashTable;
    pBVar20 = ms->tagTable;
    uVar23 = ms->hashSalt;
    cVar7 = (char)ms->rowHashLog;
    local_70 = 0xcf1bbcdcbf9b0000;
    do {
      if (local_8c == 5) {
        uVar29 = *(long *)(local_98 + uVar21) * -0x30e4432345000000;
LAB_00799e5f:
        uVar25 = (uint)((uVar29 ^ uVar23) >> (0x38U - cVar7 & 0x3f));
      }
      else {
        if (local_8c == 6) {
          uVar29 = *(long *)(local_98 + uVar21) * -0x30e4432340650000;
          goto LAB_00799e5f;
        }
        uVar25 = (*(int *)(local_98 + uVar21) * -0x61c8864f ^ (uint)uVar23) >>
                 (0x18U - cVar7 & 0x1f);
      }
      uVar13 = (uVar25 >> 8) << (bVar10 & 0x1f);
      if (((ulong)(pUVar4 + uVar13) & 0x3f) != 0) {
LAB_0079a76f:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32e,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar20 + uVar13) & ~(-1L << (bVar10 & 0x3f))) != 0) {
LAB_0079a78e:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32f,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar21 & 7] = uVar25;
      uVar21 = uVar21 + 1;
    } while (uVar28 + uVar11 != uVar21);
  }
  puVar27 = (ulong *)(srcSize + (long)src);
  if (puVar18 < local_78) {
    puVar1 = (ulong *)((long)puVar27 - 7);
    local_48 = (ulong *)((long)puVar27 + -3);
    local_50 = (ulong *)((long)puVar27 + -1);
    local_40 = puVar27 + -4;
    local_70 = ~(-1L << (bVar10 & 0x3f));
    local_80 = puVar27;
    do {
      if (uVar26 == 0) {
LAB_00799fe6:
        local_a8 = 999999999;
        if (local_8c == 6) {
          if (uVar16 == 6) {
            uVar23 = ZSTD_RowFindBestMatch_noDict_6_6(ms,(BYTE *)puVar18,(BYTE *)puVar27,&local_a8);
          }
          else if (uVar16 == 5) {
            uVar23 = ZSTD_RowFindBestMatch_noDict_6_5(ms,(BYTE *)puVar18,(BYTE *)puVar27,&local_a8);
          }
          else {
            uVar23 = ZSTD_RowFindBestMatch_noDict_6_4(ms,(BYTE *)puVar18,(BYTE *)puVar27,&local_a8);
          }
        }
        else if (local_8c == 5) {
          if (uVar16 == 6) {
            uVar23 = ZSTD_RowFindBestMatch_noDict_5_6(ms,(BYTE *)puVar18,(BYTE *)puVar27,&local_a8);
          }
          else if (uVar16 == 5) {
            uVar23 = ZSTD_RowFindBestMatch_noDict_5_5(ms,(BYTE *)puVar18,(BYTE *)puVar27,&local_a8);
          }
          else {
            uVar23 = ZSTD_RowFindBestMatch_noDict_5_4(ms,(BYTE *)puVar18,(BYTE *)puVar27,&local_a8);
          }
        }
        else if (uVar16 == 6) {
          uVar23 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)puVar18,(BYTE *)puVar27,&local_a8);
        }
        else if (uVar16 == 5) {
          uVar23 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)puVar18,(BYTE *)puVar27,&local_a8);
        }
        else {
          uVar23 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)puVar18,(BYTE *)puVar27,&local_a8);
        }
        uVar21 = 1;
        if (uVar23 != 0) {
          uVar21 = local_a8;
        }
        puVar27 = local_80;
        if (3 < uVar23) {
          if (3 < uVar21) {
            if ((src < puVar18) && (local_58 < (BYTE *)((long)puVar18 + (3 - uVar21)))) {
              puVar15 = puVar18;
              while (puVar18 = puVar15,
                    *(char *)((long)puVar15 - 1) == *(char *)((long)puVar15 + (2 - uVar21))) {
                puVar18 = (ulong *)((long)puVar15 - 1);
                uVar23 = uVar23 + 1;
                if ((puVar18 <= src) ||
                   (pBVar20 = (BYTE *)((long)puVar15 + (2 - uVar21)), puVar15 = puVar18,
                   pBVar20 <= local_58)) break;
              }
            }
            uVar9 = uVar26;
            uVar26 = (int)uVar21 - 3;
          }
          goto LAB_0079a08e;
        }
        ms->lazySkipping = (uint)(0x7ff < (ulong)((long)puVar18 - (long)src));
        puVar18 = (ulong *)((long)puVar18 + ((ulong)((long)puVar18 - (long)src) >> 8) + 1);
      }
      else {
        uVar21 = (ulong)uVar26;
        if (*(int *)(((long)puVar18 + 1) - uVar21) != *(int *)((long)puVar18 + 1))
        goto LAB_00799fe6;
        puVar15 = (ulong *)((long)puVar18 + 5);
        puVar12 = (ulong *)((long)puVar18 + (5 - uVar21));
        puVar19 = puVar15;
        if (puVar15 < puVar1) {
          uVar29 = *puVar15 ^ *puVar12;
          uVar23 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
            }
          }
          uVar23 = uVar23 >> 3 & 0x1fffffff;
          if (*puVar12 == *puVar15) {
            puVar19 = (ulong *)((long)puVar18 + 0xd);
            puVar12 = (ulong *)((long)puVar18 + (0xd - uVar21));
            do {
              if (puVar1 <= puVar19) goto LAB_0079a03b;
              uVar21 = *puVar12;
              uVar29 = *puVar19;
              uVar22 = uVar29 ^ uVar21;
              uVar23 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar23 = (long)puVar19 + ((uVar23 >> 3 & 0x1fffffff) - (long)puVar15);
              puVar19 = puVar19 + 1;
              puVar12 = puVar12 + 1;
            } while (uVar21 == uVar29);
          }
        }
        else {
LAB_0079a03b:
          if ((puVar19 < local_48) && ((int)*puVar12 == (int)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 4);
            puVar12 = (ulong *)((long)puVar12 + 4);
          }
          if ((puVar19 < local_50) && ((short)*puVar12 == (short)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 2);
            puVar12 = (ulong *)((long)puVar12 + 2);
          }
          if (puVar19 < puVar27) {
            puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar12 == (char)*puVar19));
          }
          uVar23 = (long)puVar19 - (long)puVar15;
        }
        uVar23 = uVar23 + 4;
        uVar21 = 1;
        puVar18 = (ulong *)((long)puVar18 + 1);
LAB_0079a08e:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0079a829:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_0079a7eb:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar29 = (long)puVar18 - (long)src;
        puVar15 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar15 + uVar29)) {
LAB_0079a7ad:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (puVar27 < puVar18) {
LAB_0079a7cc:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_40 < puVar18) {
          local_88 = uVar21;
          ZSTD_safecopyLiterals((BYTE *)puVar15,(BYTE *)src,(BYTE *)puVar18,(BYTE *)local_40);
          uVar21 = local_88;
          puVar27 = local_80;
        }
        else {
          uVar22 = *(ulong *)((long)src + 8);
          *puVar15 = *src;
          puVar15[1] = uVar22;
          if (0x10 < uVar29) {
            pBVar20 = seqStore->lit;
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar20 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar22 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar20 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar20 + 0x18) = uVar22;
            if (0x20 < (long)uVar29) {
              lVar14 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar14 + 0x20);
                uVar8 = puVar3[1];
                pBVar2 = pBVar20 + lVar14 + 0x20;
                *(undefined8 *)pBVar2 = *puVar3;
                *(undefined8 *)(pBVar2 + 8) = uVar8;
                puVar3 = (undefined8 *)((long)src + lVar14 + 0x30);
                uVar8 = puVar3[1];
                *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar2 + 0x18) = uVar8;
                lVar14 = lVar14 + 0x20;
              } while (pBVar2 + 0x20 < pBVar20 + uVar29);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar29;
        if (0xffff < uVar29) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar5 = seqStore->sequences;
        psVar5->litLength = (U16)uVar29;
        psVar5->offBase = (U32)uVar21;
        if (uVar23 < 3) {
LAB_0079a80a:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar23 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0079a848:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar5 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar5->mlBase = (U16)(uVar23 - 3);
        seqStore->sequences = psVar5 + 1;
        if (ms->lazySkipping != 0) {
          local_88 = CONCAT44(local_88._4_4_,uVar9);
          uVar25 = ms->nextToUpdate;
          uVar21 = (ulong)uVar25;
          uVar11 = ((int)local_78 - (int)(local_98 + uVar21)) + 1;
          if (7 < uVar11) {
            uVar11 = 8;
          }
          if (local_78 < local_98 + uVar21) {
            uVar11 = 0;
          }
          if (uVar25 < uVar11 + uVar25) {
            if (0x20 < ms->rowHashLog + 8) goto LAB_0079a886;
            pUVar4 = ms->hashTable;
            pBVar20 = ms->tagTable;
            uVar29 = ms->hashSalt;
            cVar7 = (char)ms->rowHashLog;
            do {
              if (local_8c == 5) {
                uVar22 = *(long *)(local_98 + uVar21) * -0x30e4432345000000;
LAB_0079a2c1:
                uVar28 = (uint)((uVar22 ^ uVar29) >> (0x38U - cVar7 & 0x3f));
              }
              else {
                if (local_8c == 6) {
                  uVar22 = *(long *)(local_98 + uVar21) * -0x30e4432340650000;
                  goto LAB_0079a2c1;
                }
                uVar28 = (*(int *)(local_98 + uVar21) * -0x61c8864f ^ (uint)uVar29) >>
                         (0x18U - cVar7 & 0x1f);
              }
              uVar13 = (uVar28 >> 8) << (bVar10 & 0x1f);
              if (((ulong)(pUVar4 + uVar13) & 0x3f) != 0) goto LAB_0079a76f;
              if ((local_70 & (ulong)(pBVar20 + uVar13)) != 0) goto LAB_0079a78e;
              ms->hashCache[(uint)uVar21 & 7] = uVar28;
              uVar21 = uVar21 + 1;
            } while (uVar11 + uVar25 != uVar21);
          }
          ms->lazySkipping = 0;
          puVar27 = local_80;
        }
        src = (void *)((long)puVar18 + uVar23);
        puVar18 = (ulong *)src;
        if ((uVar9 != 0) && (src <= local_78)) {
          uVar21 = (ulong)uVar26;
          uVar23 = (ulong)uVar9;
          while( true ) {
            uVar29 = uVar21;
            uVar25 = (uint)uVar29;
            uVar9 = (uint)uVar23;
            puVar18 = (ulong *)src;
            uVar26 = uVar25;
            if ((int)*src != *(int *)((long)src - uVar23)) break;
            puVar18 = (ulong *)((long)src + 4);
            puVar19 = (ulong *)((long)src + (4 - uVar23));
            puVar15 = puVar18;
            if (puVar18 < puVar1) {
              uVar22 = *puVar18 ^ *puVar19;
              uVar21 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = uVar21 >> 3 & 0x1fffffff;
              if (*puVar19 == *puVar18) {
                puVar15 = (ulong *)((long)src + 0xc);
                puVar19 = (ulong *)((long)src + (0xc - uVar23));
                do {
                  if (puVar1 <= puVar15) goto LAB_0079a40a;
                  uVar22 = *puVar19;
                  uVar6 = *puVar15;
                  uVar24 = uVar6 ^ uVar22;
                  uVar21 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  uVar21 = (long)puVar15 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar18);
                  puVar15 = puVar15 + 1;
                  puVar19 = puVar19 + 1;
                } while (uVar22 == uVar6);
              }
            }
            else {
LAB_0079a40a:
              if ((puVar15 < local_48) && ((int)*puVar19 == (int)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 4);
                puVar19 = (ulong *)((long)puVar19 + 4);
              }
              if ((puVar15 < local_50) && ((short)*puVar19 == (short)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 2);
                puVar19 = (ulong *)((long)puVar19 + 2);
              }
              if (puVar15 < puVar27) {
                puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar19 == (char)*puVar15));
              }
              uVar21 = (long)puVar15 - (long)puVar18;
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0079a829;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0079a7eb;
            puVar18 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar18) goto LAB_0079a7ad;
            if (puVar27 < src) goto LAB_0079a7cc;
            if (local_40 < src) {
              ZSTD_safecopyLiterals((BYTE *)puVar18,(BYTE *)src,(BYTE *)src,(BYTE *)local_40);
              puVar27 = local_80;
            }
            else {
              uVar22 = *(ulong *)((long)src + 8);
              *puVar18 = *src;
              puVar18[1] = uVar22;
            }
            psVar5 = seqStore->sequences;
            psVar5->litLength = 0;
            psVar5->offBase = 1;
            if (uVar21 + 4 < 3) goto LAB_0079a80a;
            if (0xffff < uVar21 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0079a848;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar5 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar5->mlBase = (U16)(uVar21 + 1);
            seqStore->sequences = psVar5 + 1;
            src = (void *)((long)src + uVar21 + 4);
            puVar18 = (ulong *)src;
            uVar26 = uVar9;
            uVar9 = uVar25;
            if ((uVar25 == 0) || (uVar21 = uVar23, uVar23 = uVar29, local_78 < src)) break;
          }
        }
      }
    } while (puVar18 < local_78);
  }
  if (local_64 <= local_5c) {
    local_64 = 0;
  }
  uVar16 = local_64;
  if (uVar26 != 0) {
    uVar16 = local_60;
  }
  if (local_60 <= local_5c) {
    uVar16 = local_64;
    local_60 = 0;
  }
  if (uVar26 != 0) {
    local_60 = uVar26;
  }
  if (uVar9 != 0) {
    uVar16 = uVar9;
  }
  *local_38 = local_60;
  local_38[1] = uVar16;
  return (long)puVar27 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_noDict);
}